

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O1

QGraphicsItem * __thiscall QGraphicsLayoutItemPrivate::parentItem(QGraphicsLayoutItemPrivate *this)

{
  QGraphicsLayoutItemPrivate *pQVar1;
  QGraphicsLayoutItem *pQVar2;
  
  pQVar2 = this->q_ptr;
  while( true ) {
    if (pQVar2 == (QGraphicsLayoutItem *)0x0) {
      return (QGraphicsItem *)0x0;
    }
    pQVar1 = (pQVar2->d_ptr).d;
    if ((pQVar1->field_0xb0 & 4) == 0) break;
    pQVar2 = pQVar1->parent;
  }
  return pQVar1->graphicsItem;
}

Assistant:

QGraphicsItem *QGraphicsLayoutItemPrivate::parentItem() const
{
    Q_Q(const QGraphicsLayoutItem);

    const QGraphicsLayoutItem *parent = q;
    while (parent && parent->isLayout()) {
        parent = parent->parentLayoutItem();
    }
    return parent ? parent->graphicsItem() : nullptr;
}